

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::PrimitiveFieldGenerator::GenerateInlineAccessorDefinitions
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "inline $type$ $classname$::$name$() const {\n  return $name$_;\n}\ninline void $classname$::set_$name$($type$ value) {\n  set_has_$name$();\n  $name$_ = value;\n}\n"
                    );
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline $type$ $classname$::$name$() const {\n"
    "  return $name$_;\n"
    "}\n"
    "inline void $classname$::set_$name$($type$ value) {\n"
    "  set_has_$name$();\n"
    "  $name$_ = value;\n"
    "}\n");
}